

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O3

void __thiscall ncnn::Mat::to_pixels(Mat *this,uchar *pixels,int type)

{
  uint uVar1;
  
  uVar1 = type >> 0x10;
  if ((uint)type < 0x10000) {
    uVar1 = type;
  }
  if (uVar1 - 1 < 2) {
    to_pixels(this,pixels,type,this->w * 3);
    return;
  }
  if (uVar1 == 3) {
    to_pixels(this,pixels,type,this->w);
    return;
  }
  if ((uVar1 & 0xfffffffe) == 4) {
    to_pixels(this,pixels,type,this->w << 2);
    return;
  }
  return;
}

Assistant:

void Mat::to_pixels(unsigned char* pixels, int type) const
{
    int type_to = (type & PIXEL_CONVERT_MASK) ? (type >> PIXEL_CONVERT_SHIFT) : (type & PIXEL_FORMAT_MASK);

    if (type_to == PIXEL_RGB || type_to == PIXEL_BGR)
    {
        to_pixels(pixels, type, w * 3);
    }
    else if (type_to == PIXEL_GRAY)
    {
        to_pixels(pixels, type, w * 1);
    }
    else if (type_to == PIXEL_RGBA || type_to == PIXEL_BGRA)
    {
        to_pixels(pixels, type, w * 4);
    }
}